

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O2

int __thiscall glslang::TPpContext::CPPpragma(TPpContext *this,TPpToken *ppToken)

{
  int iVar1;
  char *__s;
  char SrcStrName [2];
  TSourceLoc loc;
  TVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
  tokens;
  char local_a2 [2];
  pool_allocator<char> local_a0;
  TString *local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  TVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
  local_78;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  
  TVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
  ::TVector(&local_78);
  local_88 = *(undefined8 *)&(ppToken->loc).column;
  local_98 = (ppToken->loc).name;
  uStack_90._0_4_ = (ppToken->loc).string;
  uStack_90._4_4_ = (ppToken->loc).line;
  iVar1 = scanToken(this,ppToken);
  do {
    if ((iVar1 - 0x98U < 0xb) && (iVar1 - 0x98U != 9)) {
      local_a0.allocator = GetThreadPoolAllocator();
      __s = ppToken->name;
    }
    else {
      if (iVar1 == -1) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,&local_98,"directive must end with a newline","#pragma","");
        return -1;
      }
      if (iVar1 == 10) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x3a])
                  (this->parseContext,&local_98,&local_78);
        return 10;
      }
      local_a2[0] = (char)iVar1;
      local_a2[1] = 0;
      local_a0.allocator = GetThreadPoolAllocator();
      __s = local_a2;
    }
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_58,
               __s,&local_a0);
    std::
    vector<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,glslang::pool_allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
    ::
    emplace_back<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>
              ((vector<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,glslang::pool_allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
                *)&local_78,&local_58);
    iVar1 = scanToken(this,ppToken);
  } while( true );
}

Assistant:

int TPpContext::CPPpragma(TPpToken* ppToken)
{
    char SrcStrName[2];
    TVector<TString> tokens;

    TSourceLoc loc = ppToken->loc;  // because we go to the next line before processing
    int token = scanToken(ppToken);
    while (token != '\n' && token != EndOfInput) {
        switch (token) {
        case PpAtomIdentifier:
        case PpAtomConstInt:
        case PpAtomConstUint:
        case PpAtomConstInt64:
        case PpAtomConstUint64:
        case PpAtomConstInt16:
        case PpAtomConstUint16:
        case PpAtomConstFloat:
        case PpAtomConstDouble:
        case PpAtomConstFloat16:
            tokens.push_back(ppToken->name);
            break;
        default:
            SrcStrName[0] = (char)token;
            SrcStrName[1] = '\0';
            tokens.push_back(SrcStrName);
        }
        token = scanToken(ppToken);
    }

    if (token == EndOfInput)
        parseContext.ppError(loc, "directive must end with a newline", "#pragma", "");
    else
        parseContext.handlePragma(loc, tokens);

    return token;
}